

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableSet *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  ExternalInterface *pEVar4;
  Address local_110;
  ModuleRunner *local_108;
  size_t sStack_100;
  uint64_t local_f0;
  uint64_t address;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  TableInstanceInfo info;
  Flow value;
  undefined1 local_68 [8];
  Flow index;
  TableSet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  index.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,*(Expression **)(index.breakTo.super_IString.str._M_str + 0x20)
            );
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar2,
               *(Expression **)(index.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      address = (((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str)._M_len;
      uStack_e0 = *(undefined8 *)(index.breakTo.super_IString.str._M_str + 0x18);
      getTableInstanceInfo
                ((TableInstanceInfo *)local_d8,this,
                 (Name)((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str);
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      local_f0 = wasm::Literal::getUnsigned(pLVar3);
      pEVar4 = TableInstanceInfo::interface((TableInstanceInfo *)local_d8);
      local_108 = info.instance;
      sStack_100 = info.name.super_IString.str._M_len;
      wasm::Address::Address(&local_110,local_f0);
      pLVar3 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      (*pEVar4->_vptr_ExternalInterface[0x1c])(pEVar4,local_108,sStack_100,local_110.addr,pLVar3);
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSet(TableSet* curr) {
    NOTE_ENTER("TableSet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    info.interface()->tableStore(info.name, address, value.getSingleValue());
    return Flow();
  }